

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseQueue.cpp
# Opt level: O1

int __thiscall Kernel::ClauseQueue::remove(ClauseQueue *this,char *__filename)

{
  bool bVar1;
  Node *pNVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 unaff_RBP;
  void **head;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  
  uVar7 = this->_height;
  pNVar8 = this->_left;
  do {
    uVar4 = (ulong)uVar7;
    pNVar9 = pNVar8->nodes[uVar4];
    if (pNVar9 == (Node *)0x0) {
LAB_0052d151:
      if (uVar7 == 0) {
        unaff_RBP = 0;
LAB_0052d293:
        uVar7 = 0;
        bVar1 = false;
        pNVar9 = pNVar8;
      }
      else {
        uVar7 = uVar7 - 1;
        bVar1 = true;
        pNVar9 = pNVar8;
      }
    }
    else {
      if (pNVar9->clause == (Clause *)__filename) {
        pNVar8->nodes[uVar4] = pNVar9->nodes[uVar4];
        uVar5 = uVar4;
        if (uVar7 != 0) {
          do {
            uVar6 = uVar5 - 1;
            pNVar2 = pNVar8;
            do {
              pNVar8 = pNVar2;
              pNVar2 = pNVar8->nodes[uVar5 - 1];
            } while (pNVar8->nodes[uVar5 - 1] != pNVar9);
            pNVar8->nodes[uVar5 - 1] = pNVar9->nodes[uVar5 - 1];
            uVar5 = uVar6;
          } while (uVar6 != 0);
        }
        uVar4 = uVar4 * 8 + 0x1f & 0xffffffff0;
        if (uVar4 == 0) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar9;
        }
        else if (uVar4 < 0x11) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar9;
        }
        else if (uVar4 < 0x19) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar9;
        }
        else if (uVar4 < 0x21) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar9;
        }
        else if (uVar4 < 0x31) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar9;
        }
        else if (uVar4 < 0x41) {
          pNVar9->clause = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar9;
        }
        else {
          operator_delete(pNVar9,0x10);
        }
        uVar7 = this->_height;
        unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
        if (uVar7 != 0) {
          do {
            if (this->_left->nodes[uVar7] != (Node *)0x0) break;
            uVar7 = uVar7 - 1;
            this->_height = uVar7;
          } while (uVar7 != 0);
        }
        goto LAB_0052d293;
      }
      iVar3 = (*this->_vptr_ClauseQueue[2])(this,__filename);
      bVar1 = true;
      if ((char)iVar3 != '\0') goto LAB_0052d151;
    }
    pNVar8 = pNVar9;
    if (!bVar1) {
      return (uint)unaff_RBP & 0xffffff01;
    }
  } while( true );
}

Assistant:

bool ClauseQueue::remove(Clause* c)
{
  unsigned h = _height;
  Node* left = _left;

  for (;;) {
    Node* next = left->nodes[h];
    if (next && c == next->clause) {
      unsigned height = h;
      // found, first change the links going to next
      for (;;) {
	left->nodes[h] = next->nodes[h];
	if (h == 0) {
	  break;
	}
	h--;
	while (left->nodes[h] != next) {
	  left = left->nodes[h];
	}
      }
      // deallocate the node
      DEALLOC_KNOWN(next,
		    sizeof(Node)+height*sizeof(Node*),
		    "ClauseQueue::Node");
      while (_height > 0 && ! _left->nodes[_height]) {
	_height--;
      }
      return true;
    }

    if (next == 0 || lessThan(c,next->clause)) {
      if(h==0) {

#if VDEBUG
       ClauseQueue::Iterator it(*this);
       while(it.hasNext()){
         ASS(it.next()!=c);
       }
#endif

	return false;
      }
      h--;
    }
    else {
      left = next;
    }
  }
}